

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O1

int disarm_shooting_trap(trap *ttmp,int otyp,schar dx,schar dy)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  
  uVar1 = try_disarm(ttmp,'\0',dx,dy);
  if (1 < uVar1) {
    pline("You disarm %s trap.",the_your[(byte)ttmp->field_0x8 >> 7]);
    uVar1 = mt_random();
    lVar5 = (long)u.uluck;
    lVar4 = (long)u.moreluck;
    iVar2 = (int)(lVar4 + lVar5);
    if (otyp == 8) {
      uVar1 = uVar1 % 10;
      if (iVar2 != 0) {
        uVar3 = mt_random();
        if (SUB168(ZEXT416(uVar3) % SEXT816(0x32 - (lVar4 + lVar5)),0) != 0) {
          iVar6 = (int)u.moreluck + (int)u.uluck;
          iVar2 = iVar6 / 3;
          if (iVar6 < -5) {
            iVar2 = iVar6;
          }
          uVar3 = uVar1 - iVar2;
          uVar1 = 0;
          if ((-1 < (int)uVar3) && (uVar1 = 9, (int)uVar3 < 9)) {
            uVar1 = uVar3;
          }
        }
      }
      iVar2 = 10;
    }
    else {
      uVar1 = uVar1 % 0x32;
      if (iVar2 != 0) {
        uVar3 = mt_random();
        if (((SUB168(ZEXT416(uVar3) % SEXT816((long)(0x32 - iVar2)),0) != 0) &&
            (uVar3 = uVar1 - ((int)u.moreluck + (int)u.uluck), uVar1 = 0, -1 < (int)uVar3)) &&
           (uVar1 = 0x31, (int)uVar3 < 0x31)) {
          uVar1 = uVar3;
        }
      }
      iVar2 = 0x32;
    }
    cnv_trap_obj(otyp,iVar2 - uVar1,ttmp);
    uVar1 = 1;
  }
  return uVar1;
}

Assistant:

static int disarm_shooting_trap(struct trap *ttmp, int otyp, schar dx, schar dy)
{
	int fails = try_disarm(ttmp, FALSE, dx, dy);

	if (fails < 2)
	    return fails;
	pline("You disarm %s trap.", the_your[ttmp->madeby_u]);
	cnv_trap_obj(otyp, otyp == SHURIKEN ? 10-rnl(10) : 50-rnl(50), ttmp);
	return 1;
}